

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O2

void __thiscall
pzgeom::TPZArc3D::X<Fad<double>>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *loc,
          TPZVec<Fad<double>_> *result)

{
  double dVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  int i_1;
  int i;
  long lVar4;
  int j;
  long lVar5;
  long lVar6;
  Fad<double> *local_278;
  Fad<double> *local_270;
  double dStack_268;
  Fad<double> *local_260;
  Fad<double> centerCoord;
  Fad<double> vectRotated;
  Fad<double> deflection;
  TPZManVector<Fad<double>,_3> MappedBASE2D;
  TPZFNMatrix<4,_Fad<double>_> RotMatrix;
  
  RotMatrix.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  RotMatrix.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow.
  _0_4_ = 0;
  RotMatrix.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol =
       0;
  RotMatrix.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  RotMatrix.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  RotMatrix.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_
       = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&MappedBASE2D,3,(Fad<double> *)&RotMatrix);
  Fad<double>::~Fad((Fad<double> *)&RotMatrix);
  TPZFNMatrix<4,_Fad<double>_>::TPZFNMatrix(&RotMatrix,2,2);
  dVar1 = this->fRadius;
  centerCoord.dx_._0_8_ = this->fAngle * dVar1;
  local_278 = loc->fStore;
  local_270 = (Fad<double> *)0x3ff0000000000000;
  dStack_268 = 0.0;
  vectRotated.val_ = (double)&centerCoord;
  centerCoord.dx_.ptr_to_data = (double *)0x0;
  vectRotated.dx_._0_8_ = dVar1 + dVar1;
  vectRotated.dx_.ptr_to_data = (double *)0x0;
  centerCoord.defaultVal = (double)&local_278;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,FadCst<double>>>>>,FadCst<double>>>
            (&deflection,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>,_FadCst<double>_>_>
              *)&vectRotated);
  cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)&centerCoord,&deflection);
  pFVar2 = TPZFMatrix<Fad<double>_>::operator()(&RotMatrix.super_TPZFMatrix<Fad<double>_>,0,0);
  Fad<double>::operator=(pFVar2,(FadExpr<FadFuncCos<Fad<double>_>_> *)&centerCoord);
  Fad<double>::~Fad((Fad<double> *)&centerCoord.dx_);
  sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)&centerCoord,&deflection);
  pFVar2 = TPZFMatrix<Fad<double>_>::operator()(&RotMatrix.super_TPZFMatrix<Fad<double>_>,0,1);
  Fad<double>::operator=(pFVar2,(FadExpr<FadFuncSin<Fad<double>_>_> *)&centerCoord);
  Fad<double>::~Fad((Fad<double> *)&centerCoord.dx_);
  sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)&centerCoord,&deflection);
  vectRotated.val_ = (double)&centerCoord;
  pFVar2 = TPZFMatrix<Fad<double>_>::operator()(&RotMatrix.super_TPZFMatrix<Fad<double>_>,1,0);
  Fad<double>::operator=
            (pFVar2,(FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)&vectRotated);
  Fad<double>::~Fad((Fad<double> *)&centerCoord.dx_);
  cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)&centerCoord,&deflection);
  pFVar2 = TPZFMatrix<Fad<double>_>::operator()(&RotMatrix.super_TPZFMatrix<Fad<double>_>,1,1);
  Fad<double>::operator=(pFVar2,(FadExpr<FadFuncCos<Fad<double>_>_> *)&centerCoord);
  Fad<double>::~Fad((Fad<double> *)&centerCoord.dx_);
  Fad<double>::Fad(&centerCoord);
  vectRotated.val_ = 0.0;
  vectRotated.dx_._0_8_ = vectRotated.dx_._0_8_ & 0xffffffff00000000;
  vectRotated.dx_.ptr_to_data = (double *)0x0;
  vectRotated.defaultVal = 0.0;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    local_278 = (Fad<double> *)0x0;
    Fad<double>::operator=<double,_nullptr>(&vectRotated,(double *)&local_278);
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      local_278 = TPZFMatrix<Fad<double>_>::operator()
                            (&RotMatrix.super_TPZFMatrix<Fad<double>_>,lVar4,lVar5);
      local_270 = (Fad<double> *)(this->finitialVector).super_TPZVec<double>.fStore[lVar5];
      dStack_268 = 0.0;
      Fad<double>::operator+=
                (&vectRotated,(FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)&local_278);
    }
    local_278 = (Fad<double> *)
                ((double)(1 - (int)lVar4) * this->fXcenter + (double)(int)lVar4 * this->fYcenter);
    Fad<double>::operator=<double,_nullptr>(&centerCoord,(double *)&local_278);
    local_278 = &centerCoord;
    local_270 = &vectRotated;
    Fad<double>::operator=
              (MappedBASE2D.super_TPZVec<Fad<double>_>.fStore + lVar4,
               (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)&local_278);
  }
  local_278 = (Fad<double> *)0x0;
  Fad<double>::operator=<double,_nullptr>
            (MappedBASE2D.super_TPZVec<Fad<double>_>.fStore + 2,(double *)&local_278);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    local_278 = (Fad<double> *)0x0;
    Fad<double>::operator=<double,_nullptr>(&vectRotated,(double *)&local_278);
    lVar5 = 0;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      local_270 = (Fad<double> *)
                  (this->fIBaseCn).super_TPZFMatrix<double>.fElem
                  [(this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow * lVar6 + lVar4];
      local_260 = (Fad<double> *)
                  ((long)&(MappedBASE2D.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5);
      dStack_268 = 0.0;
      Fad<double>::operator+=
                (&vectRotated,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_278);
      lVar5 = lVar5 + 0x20;
    }
    pdVar3 = TPZFMatrix<double>::operator()(coord,lVar4,2);
    local_270 = (Fad<double> *)*pdVar3;
    dStack_268 = 0.0;
    local_278 = &vectRotated;
    Fad<double>::operator=
              (result->fStore + lVar4,
               (FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)&local_278);
  }
  Fad<double>::~Fad(&vectRotated);
  Fad<double>::~Fad(&centerCoord);
  Fad<double>::~Fad(&deflection);
  TPZFNMatrix<4,_Fad<double>_>::~TPZFNMatrix(&RotMatrix);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&MappedBASE2D);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            /** Computing initialVector = (iniR2 - CenterR2) */
            TPZManVector<T,3> MappedBASE2D(3,0.);
            
            TPZFNMatrix<4,T> RotMatrix(2,2);
            T deflection = fAngle * fRadius * (loc[0] + 1.) / (2.*fRadius);
            RotMatrix(0,0) =  cos(deflection); RotMatrix(0,1) = sin(deflection);
            RotMatrix(1,0) = -sin(deflection); RotMatrix(1,1) = cos(deflection);
            
            /** MappedPoint_R2 = centerCoord + vectorRotated , where Vx = RotationMatrix . Va */
            T centerCoord, vectRotated = 0.;
            for(int i = 0; i < 2; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 2; j++) vectRotated += RotMatrix(i,j)*finitialVector[j];
                centerCoord = (1-i)*fXcenter + i*fYcenter;
                MappedBASE2D[i] = centerCoord + vectRotated;
            }
            
            /** Changing Basis of Obtained MappedPoint from R2 to R3 */
            MappedBASE2D[2] = 0.;
            for(int i = 0; i < 3; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 3; j++)
                {
                    vectRotated += fIBaseCn.GetVal(i,j)*MappedBASE2D[j];
                }
                result[i] = vectRotated + coord(i,2);
            }

        }